

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_converter.hpp
# Opt level: O0

type * __thiscall
jsoncons::
value_converter<jsoncons::byte_string_view,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
::convert<char>(value_converter<jsoncons::byte_string_view,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                *this,byte_string_view *value,semantic_tag tag,error_code *param_4)

{
  const_iterator puVar1;
  char in_CL;
  byte_string_view *in_RDX;
  type *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  value_converter_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  uchar *in_stack_ffffffffffffffa0;
  allocator<char> local_2a;
  undefined1 local_29;
  char local_19;
  byte_string_view *local_18;
  
  local_29 = 0;
  local_19 = in_CL;
  local_18 = in_RDX;
  value_converter_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::get_allocator(in_stack_ffffffffffffff88);
  std::__cxx11::string::string((string *)in_RDI,(allocator *)&local_2a);
  std::allocator<char>::~allocator(&local_2a);
  if (local_19 == '\b') {
    puVar1 = byte_string_view::begin(local_18);
    byte_string_view::end(local_18);
    encode_base16<unsigned_char_const*,std::__cxx11::string>
              (in_stack_ffffffffffffffa0,puVar1,in_stack_ffffffffffffff90);
  }
  else if (local_19 == '\t') {
    byte_string_view::begin(local_18);
    byte_string_view::end(local_18);
    encode_base64<unsigned_char_const*,std::__cxx11::string>
              ((uchar *)in_stack_ffffffffffffff90,(uchar *)in_stack_ffffffffffffff88,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x222b00);
  }
  else {
    puVar1 = byte_string_view::begin(local_18);
    byte_string_view::end(local_18);
    encode_base64url<unsigned_char_const*,std::__cxx11::string>
              (puVar1,(uchar *)in_stack_ffffffffffffff88,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x222b78);
  }
  return in_RDI;
}

Assistant:

typename std::enable_if<ext_traits::is_narrow_character<CharT>::value,Into>::type
        convert(const From& value, semantic_tag tag, std::error_code&)
        {
            Into s(this->get_allocator());
            switch (tag)
            {
                case semantic_tag::base64:
                    encode_base64(value.begin(), value.end(), s);
                    break;
                case semantic_tag::base16:
                    encode_base16(value.begin(), value.end(), s);
                    break;
                default:
                    encode_base64url(value.begin(), value.end(), s);
                    break;
            }
            return s;
        }